

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

void Cec_ManLSCorrespondenceBmc(Gia_Man_t *pAig,Cec_ParCor_t *pPars,int nPrefs)

{
  Vec_Str_t *vStatus_00;
  Gia_Man_t *pSim;
  abctime aVar1;
  Gia_Man_t *p;
  Vec_Int_t *vCexStore;
  abctime aVar2;
  Gia_Man_t *p_00;
  int fRings;
  Vec_Int_t **pvOutputs;
  int in_R9D;
  bool bVar3;
  Vec_Str_t *vStatus;
  Vec_Int_t *vOutputs;
  int local_a4;
  Gia_Man_t *local_a0;
  Gia_Man_t *local_98;
  ulong local_90;
  Cec_ParSat_t ParsSat;
  Cec_ParSim_t ParsSim;
  
  Cec_ManSimSetDefaultParams(&ParsSim);
  ParsSim.nWords = pPars->nWords;
  ParsSim.nFrames = pPars->nRounds;
  ParsSim.fVerbose = pPars->fVerbose;
  ParsSim.fLatchCorr = pPars->fLatchCorr;
  ParsSim.fSeqSimulate = 1;
  local_98 = pAig;
  local_a0 = (Gia_Man_t *)Cec_ManSimStart(pAig,&ParsSim);
  Cec_ManSatSetDefaultParams(&ParsSat);
  ParsSat.nBTLimit = pPars->nBTLimit;
  ParsSat.fVerbose = pPars->fVerbose;
  local_a4 = nPrefs + 1;
  bVar3 = true;
  local_90 = (ulong)(uint)nPrefs;
  do {
    if (!bVar3) {
LAB_0051bf73:
      Cec_ManSimStop((Cec_ManSim_t *)local_a0);
      return;
    }
    aVar1 = Abc_Clock();
    pvOutputs = &vOutputs;
    p = Gia_ManCorrSpecReduceInit
                  (local_98,pPars->nFrames,(int)local_90,(uint)(pPars->fLatchCorr == 0),pvOutputs,
                   in_R9D);
    fRings = (int)pvOutputs;
    if (p->vCos->nSize == p->nRegs) {
      Gia_ManStop(p);
      Vec_IntFree(vOutputs);
      goto LAB_0051bf73;
    }
    ParsSat.nBTLimit = ParsSat.nBTLimit * 10;
    if (pPars->fUseCSat == 0) {
      vCexStore = Cec_ManSatSolveMiter(p,&ParsSat,&vStatus);
    }
    else {
      vCexStore = Tas_ManSolveMiterNc(p,pPars->nBTLimit,&vStatus,0);
    }
    pSim = local_a0;
    bVar3 = vCexStore->nSize != 0;
    if (bVar3) {
      p_00 = local_a0;
      Cec_ManResimulateCounterExamples((Cec_ManSim_t *)local_a0,vCexStore,pPars->nFrames + local_a4)
      ;
      Gia_ManCheckRefinements(p_00,vStatus,vOutputs,(Cec_ManSim_t *)pSim,fRings);
    }
    vStatus_00 = vStatus;
    if (pPars->fVerbose != 0) {
      aVar2 = Abc_Clock();
      Cec_ManRefinedClassPrintStats(local_98,vStatus_00,-1,aVar2 - aVar1);
    }
    Vec_IntFree(vCexStore);
    Vec_StrFree(vStatus);
    Gia_ManStop(p);
    Vec_IntFree(vOutputs);
  } while( true );
}

Assistant:

void Cec_ManLSCorrespondenceBmc( Gia_Man_t * pAig, Cec_ParCor_t * pPars, int nPrefs )
{  
    Cec_ParSim_t ParsSim, * pParsSim = &ParsSim;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Vec_Str_t * vStatus;
    Vec_Int_t * vOutputs;
    Vec_Int_t * vCexStore;
    Cec_ManSim_t * pSim;
    Gia_Man_t * pSrm;
    int fChanges, RetValue;
    // prepare simulation manager
    Cec_ManSimSetDefaultParams( pParsSim );
    pParsSim->nWords     = pPars->nWords;
    pParsSim->nFrames    = pPars->nRounds;
    pParsSim->fVerbose   = pPars->fVerbose;
    pParsSim->fLatchCorr = pPars->fLatchCorr;
    pParsSim->fSeqSimulate = 1;
    pSim = Cec_ManSimStart( pAig, pParsSim );
    // prepare SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVerbose;
    fChanges = 1;
    while ( fChanges )
    {
        abctime clkBmc = Abc_Clock();
        fChanges = 0;
        pSrm = Gia_ManCorrSpecReduceInit( pAig, pPars->nFrames, nPrefs, !pPars->fLatchCorr, &vOutputs, pPars->fUseRings );
        if ( Gia_ManPoNum(pSrm) == 0 )
        {
            Gia_ManStop( pSrm );
            Vec_IntFree( vOutputs );
            break;
        } 
        pParsSat->nBTLimit *= 10;
        if ( pPars->fUseCSat )
            vCexStore = Tas_ManSolveMiterNc( pSrm, pPars->nBTLimit, &vStatus, 0 );
        else
            vCexStore = Cec_ManSatSolveMiter( pSrm, pParsSat, &vStatus );
        // refine classes with these counter-examples
        if ( Vec_IntSize(vCexStore) )
        {
            RetValue = Cec_ManResimulateCounterExamples( pSim, vCexStore, pPars->nFrames + 1 + nPrefs );
            Gia_ManCheckRefinements( pAig, vStatus, vOutputs, pSim, pPars->fUseRings );
            fChanges = 1;
        }
        if ( pPars->fVerbose )
            Cec_ManRefinedClassPrintStats( pAig, vStatus, -1, Abc_Clock() - clkBmc );
        // recycle
        Vec_IntFree( vCexStore );
        Vec_StrFree( vStatus );
        Gia_ManStop( pSrm );
        Vec_IntFree( vOutputs );
    }
    Cec_ManSimStop( pSim );
}